

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O1

void CorUnix::CriticalSectionSubSysInitialize(void)

{
  bool bVar1;
  
  LOCK();
  bVar1 = csssInitState == 0;
  if (bVar1) {
    csssInitState = 1;
  }
  UNLOCK();
  if (bVar1) {
    PTR_g_PALCSList_01560a70 = (undefined *)&g_PALCSList;
    g_PALCSList = (undefined *)&g_PALCSList;
    InternalInitializeCriticalSectionAndSpinCount((PCRITICAL_SECTION)&g_csPALCSsListLock,0,true);
    LOCK();
    csssInitState = 2;
    UNLOCK();
  }
  else {
    while (csssInitState != 2) {
      sched_yield();
    }
  }
  return;
}

Assistant:

void CriticalSectionSubSysInitialize()
    {
        static_assert(sizeof(CRITICAL_SECTION) >= sizeof(PAL_CRITICAL_SECTION),
            "PAL fatal internal error: sizeof(CRITICAL_SECTION) is "
            "smaller than sizeof(PAL_CRITICAL_SECTION)");

#ifdef _DEBUG
        LONG lRet = InterlockedCompareExchange((LONG *)&csssInitState,
                                               (LONG)CSSubSysInitializing,
                                               (LONG)CSSubSysNotInitialzed);
        if ((LONG)CSSubSysNotInitialzed == lRet)
        {
            InitializeListHead(&g_PALCSList);

            InternalInitializeCriticalSectionAndSpinCount(
                reinterpret_cast<CRITICAL_SECTION*>(&g_csPALCSsListLock),
                0, true);
            InterlockedExchange((LONG *)&csssInitState,
                                (LONG)CSSubSysInitialized);
        }
        else
        {
            while (csssInitState != CSSubSysInitialized)
            {
                sched_yield();
            }
        }
#endif // _DEBUG
    }